

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

bool FS_ChangeMusic(char *string)

{
  bool bVar1;
  int iVar2;
  char buffer [40];
  char acStack_38 [40];
  
  iVar2 = FWadCollection::CheckNumForName(&Wads,string,0x10);
  if ((-1 < iVar2) && (bVar1 = S_ChangeMusic(string,1,true,false), bVar1)) {
    return true;
  }
  mysnprintf(acStack_38,0x28,"O_%s");
  iVar2 = FWadCollection::CheckNumForName(&Wads,acStack_38,0x10);
  if ((-1 < iVar2) && (bVar1 = S_ChangeMusic(acStack_38,1,true,false), bVar1)) {
    return true;
  }
  mysnprintf(acStack_38,0x28,"D_%s");
  iVar2 = FWadCollection::CheckNumForName(&Wads,acStack_38,0x10);
  if (iVar2 < 0) {
    S_ChangeMusic((char *)0x0,0,true,false);
  }
  else {
    S_ChangeMusic(acStack_38,1,true,false);
  }
  return iVar2 >= 0;
}

Assistant:

bool FS_ChangeMusic(const char * string)
{
	char buffer[40];

	if (Wads.CheckNumForName(string, ns_music)<0 || !S_ChangeMusic(string,true))
	{
		// Retry with O_ prepended to the music name, then with D_
		mysnprintf(buffer, countof(buffer), "O_%s", string);
		if (Wads.CheckNumForName(buffer, ns_music)<0 || !S_ChangeMusic(buffer,true))
		{
			mysnprintf(buffer, countof(buffer), "D_%s", string);
			if (Wads.CheckNumForName(buffer, ns_music)<0) 
			{
				S_ChangeMusic(NULL, 0);
				return false;
			}
			else S_ChangeMusic(buffer,true);
		}
	}
	return true;
}